

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNode * __thiscall Parser::atom(Parser *this,Token *tok)

{
  pointer pcVar1;
  ExprNode *this_00;
  undefined8 extraout_RAX;
  Token closeParen;
  undefined1 local_268 [32];
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [32];
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [32];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  Token local_98;
  
  if (tok->_isWholeNumber == true) {
    this_00 = (ExprNode *)operator_new(0x80);
    pcVar1 = (tok->_name)._M_dataplus._M_p;
    local_188._0_8_ = local_188 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_188,pcVar1,pcVar1 + (tok->_name)._M_string_length);
    pcVar1 = (tok->_relOp)._M_dataplus._M_p;
    local_168._M_p = (pointer)&local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar1,pcVar1 + (tok->_relOp)._M_string_length);
    local_148._0_1_ = tok->_eof;
    local_148._1_1_ = tok->_eol;
    local_148._2_1_ = tok->_ind;
    local_148._3_1_ = tok->_ded;
    uStack_144._0_1_ = tok->_isWholeNumber;
    uStack_144._1_1_ = tok->_isString;
    uStack_144._2_1_ = tok->_symbol;
    uStack_144._3_1_ = tok->field_0x47;
    uStack_140 = *(undefined4 *)&tok->_wholeNumber;
    uStack_13c = *(undefined4 *)((long)&tok->_wholeNumber + 4);
    pcVar1 = (tok->_string)._M_dataplus._M_p;
    local_138._M_p = (pointer)&local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar1,pcVar1 + (tok->_string)._M_string_length);
    WholeNumber::WholeNumber((WholeNumber *)this_00,(Token *)local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != &local_128) {
      operator_delete(local_138._M_p,local_128._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p != &local_158) {
      operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
    }
    local_268._16_8_ = local_188._16_8_;
    local_98._name._M_dataplus._M_p = (pointer)local_188._0_8_;
    if ((undefined1 *)local_188._0_8_ == local_188 + 0x10) {
      return this_00;
    }
  }
  else if ((tok->_name)._M_string_length == 0) {
    if (tok->_symbol == '(') {
      this_00 = exprOrTest(this);
      tok = &local_98;
      Tokenizer::getToken(tok,this->tokenizer);
      if (local_98._symbol != ')') {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8.field_2._M_allocated_capacity._0_7_ = 0x3a726573726150;
        local_b8.field_2._M_local_buf[7] = ':';
        local_b8.field_2._8_7_ = 0x7972616d697270;
        local_b8._M_string_length = 0xf;
        local_b8.field_2._M_local_buf[0xf] = '\0';
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"Expected close-parenthesis, instead got","");
        die(this,&local_b8,&local_f8,&local_98);
LAB_0010d4c8:
        local_d8.field_2._M_allocated_capacity._0_7_ = 0x3a726573726150;
        local_d8.field_2._M_local_buf[7] = ':';
        local_d8.field_2._8_7_ = 0x7972616d697270;
        local_d8._M_string_length = 0xf;
        local_d8.field_2._M_local_buf[0xf] = '\0';
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Unexpected token","");
        die(this,&local_d8,&local_118,tok);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          CONCAT17(local_d8.field_2._M_local_buf[7],
                                   local_d8.field_2._M_allocated_capacity._0_7_) + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._string._M_dataplus._M_p != &local_98._string.field_2) {
        operator_delete(local_98._string._M_dataplus._M_p,
                        local_98._string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._relOp._M_dataplus._M_p != &local_98._relOp.field_2) {
        operator_delete(local_98._relOp._M_dataplus._M_p,
                        local_98._relOp.field_2._M_allocated_capacity + 1);
      }
      local_268._16_8_ = local_98._name.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._name._M_dataplus._M_p == &local_98._name.field_2) {
        return this_00;
      }
    }
    else {
      if (tok->_isString != true) goto LAB_0010d4c8;
      this_00 = (ExprNode *)operator_new(0x80);
      pcVar1 = (tok->_name)._M_dataplus._M_p;
      local_268._0_8_ = local_268 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_268,pcVar1,pcVar1);
      pcVar1 = (tok->_relOp)._M_dataplus._M_p;
      local_248._M_p = (pointer)&local_238;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar1,pcVar1 + (tok->_relOp)._M_string_length);
      local_228._0_1_ = tok->_eof;
      local_228._1_1_ = tok->_eol;
      local_228._2_1_ = tok->_ind;
      local_228._3_1_ = tok->_ded;
      uStack_224._0_1_ = tok->_isWholeNumber;
      uStack_224._1_1_ = tok->_isString;
      uStack_224._2_1_ = tok->_symbol;
      uStack_224._3_1_ = tok->field_0x47;
      uStack_220 = *(undefined4 *)&tok->_wholeNumber;
      uStack_21c = *(undefined4 *)((long)&tok->_wholeNumber + 4);
      pcVar1 = (tok->_string)._M_dataplus._M_p;
      local_218._M_p = (pointer)&local_208;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar1,pcVar1 + (tok->_string)._M_string_length);
      String::String((String *)this_00,(Token *)local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_p != &local_208) {
        operator_delete(local_218._M_p,local_208._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_p != &local_238) {
        operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
      }
      local_98._name._M_dataplus._M_p = (pointer)local_268._0_8_;
      if ((undefined1 *)local_268._0_8_ == local_268 + 0x10) {
        return this_00;
      }
    }
  }
  else {
    Tokenizer::ungetToken(this->tokenizer);
    this_00 = (ExprNode *)operator_new(0x80);
    pcVar1 = (tok->_name)._M_dataplus._M_p;
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f8,pcVar1,pcVar1 + (tok->_name)._M_string_length);
    pcVar1 = (tok->_relOp)._M_dataplus._M_p;
    local_1d8._M_p = (pointer)&local_1c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar1,pcVar1 + (tok->_relOp)._M_string_length);
    local_1b8._0_1_ = tok->_eof;
    local_1b8._1_1_ = tok->_eol;
    local_1b8._2_1_ = tok->_ind;
    local_1b8._3_1_ = tok->_ded;
    uStack_1b4._0_1_ = tok->_isWholeNumber;
    uStack_1b4._1_1_ = tok->_isString;
    uStack_1b4._2_1_ = tok->_symbol;
    uStack_1b4._3_1_ = tok->field_0x47;
    uStack_1b0 = *(undefined4 *)&tok->_wholeNumber;
    uStack_1ac = *(undefined4 *)((long)&tok->_wholeNumber + 4);
    pcVar1 = (tok->_string)._M_dataplus._M_p;
    local_1a8._M_p = (pointer)&local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,pcVar1,pcVar1 + (tok->_string)._M_string_length);
    Variable::Variable((Variable *)this_00,(Token *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p,local_198._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_p != &local_1c8) {
      operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
    }
    local_268._16_8_ = local_1f8._16_8_;
    local_98._name._M_dataplus._M_p = (pointer)local_1f8._0_8_;
    if ((undefined1 *)local_1f8._0_8_ == local_1f8 + 0x10) {
      return this_00;
    }
  }
  operator_delete(local_98._name._M_dataplus._M_p,local_268._16_8_ + 1);
  return this_00;
}

Assistant:

ExprNode *Parser::atom(Token tok) {
    // atom: ID | NUMBER | STRING+ | ( test )
    // This function parses the grammar rules:

    // <primary> -> [0-9]+
    // <primary> -> [_a-zA-Z][_a-zA-Z0-9]*
    // <primary> -> (<expr>)

    //Token tok = tokenizer.getToken();
    if (tok.isWholeNumber() )
        return new WholeNumber(tok);
    else if( tok.isName() ) {
        tokenizer.ungetToken();
        //ExprNode * id = variableID();
        return new Variable(tok);;
    }
    else if (tok.isOpenParen()) {
        ExprNode *p = test();
        Token closeParen = tokenizer.getToken();
        if (!closeParen.isCloseParen())
            die("Parser::primary", "Expected close-parenthesis, instead got", closeParen);
        return p;
    } else if(tok.isString())
        return new String(tok);

    die("Parser::primary", "Unexpected token", tok);
    return nullptr;  // Will not reach this statement!
}